

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

void fdump_attr_list(void *file,attr_list list)

{
  if (global_as_lock != (atl_lock_func)0x0) {
    (*global_as_lock)(global_as_lock_data);
  }
  if (global_as == (atom_server)0x0) {
    global_as = init_atom_server(prefill_atom_cache);
    if (init_global_atom_server_first == '\0') {
      init_global_atom_server_first = '\x01';
    }
  }
  if (global_as_unlock != (atl_lock_func)0x0) {
    (*global_as_unlock)(global_as_lock_data);
  }
  fprintf((FILE *)file,"Attribute list %p, ref_count = %d\n",list,(ulong)(uint)(int)list->ref_count)
  ;
  internal_dump_attr_list((FILE *)file,list,0);
  return;
}

Assistant:

extern void
fdump_attr_list(void *file, attr_list list)
{
    FILE *out = (FILE*)file;
    atl_lock();
    init_global_atom_server(&global_as);
    atl_unlock();
    fprintf(out, "Attribute list %p, ref_count = %d\n", list, list->ref_count);
    internal_dump_attr_list(out, list, 0);
}